

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O1

bool __thiscall http::Page::SendFile(Page *this,char *filename)

{
  int iVar1;
  FILE *__stream;
  ostream *poVar2;
  size_t sVar3;
  uchar buffer [512];
  char s [512];
  undefined1 auStack_428 [512];
  char local_228 [520];
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    poVar2 = &this->m_ostream;
    fseek(__stream,0,2);
    ftell(__stream);
    fseek(__stream,0,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"HTTP/1.0 200 OK\r\nContent-Type: application/java-archive\r\n",0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Content-Length: ",0x10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n\r\n",4);
    sVar3 = strlen(local_228);
    RawSend(this,local_228,(long)(int)sVar3);
    sVar3 = fread(auStack_428,1,0x200,__stream);
    iVar1 = (int)sVar3;
    while (0 < iVar1) {
      RawSend(this,auStack_428,(ulong)((uint)sVar3 & 0x7fffffff));
      sVar3 = fread(auStack_428,1,0x200,__stream);
      iVar1 = (int)sVar3;
    }
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool http::Page::SendFile(const char* filename)
{
    char s[BUFFER_SIZE];
    FILE* f;
    bool rc = false;
    unsigned char buffer[512];
    uint64_t counti64;
    int count;
    std::ostream& out = get_output_stream();

    f = fopen(filename, "rb");
    if (f)
    {
#ifdef _WIN32
        _fseeki64(f, 0, SEEK_END);
        counti64 = _ftelli64(f);
        _fseeki64(f, 0, SEEK_SET);
#elif __linux__
        fseek(f, 0, SEEK_END);
        counti64 = ftell(f);
        fseek(f, 0, SEEK_SET);
#endif
        out << "HTTP/1.0 200 OK\r\nContent-Type: application/java-archive\r\n";
        out << "Content-Length: " << counti64 << "\r\n\r\n";
        SendString(s);

        do
        {
            count = (int)fread(buffer, 1, sizeof(buffer), f);
            if (count > 0)
            {
                RawSend(buffer, count);
            }
        } while (count > 0);

        rc = true;
    }

    return rc;
}